

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O1

size_t ZSTD_buildCTable(void *dst,size_t dstCapacity,FSE_CTable *nextCTable,U32 FSELog,
                       symbolEncodingType_e type,uint *count,U32 max,BYTE *codeTable,size_t nbSeq,
                       S16 *defaultNorm,U32 defaultNormLog,U32 defaultMax,FSE_CTable *prevCTable,
                       size_t prevCTableSize,void *entropyWorkspace,size_t entropyWorkspaceSize)

{
  uint tableLog;
  size_t err_code;
  size_t sVar1;
  size_t sVar2;
  
  switch(type) {
  case set_basic:
    sVar2 = FSE_buildCTable_wksp
                      (nextCTable,defaultNorm,defaultMax,defaultNormLog,entropyWorkspace,
                       entropyWorkspaceSize);
    sVar1 = 0;
    if (0xffffffffffffff88 < sVar2) {
      sVar1 = sVar2;
    }
    break;
  case set_rle:
    sVar1 = FSE_buildCTable_rle(nextCTable,(BYTE)max);
    if (sVar1 < 0xffffffffffffff89) {
      if (dstCapacity == 0) {
        sVar1 = 0xffffffffffffffba;
      }
      else {
        *(BYTE *)dst = *codeTable;
        sVar1 = 1;
      }
    }
    break;
  case set_compressed:
    tableLog = FSE_optimalTableLog(FSELog,nbSeq,max);
    if (1 < count[codeTable[nbSeq - 1]]) {
      count[codeTable[nbSeq - 1]] = count[codeTable[nbSeq - 1]] - 1;
      nbSeq = nbSeq - 1;
    }
    sVar1 = FSE_normalizeCount((short *)entropyWorkspace,tableLog,count,nbSeq,max,
                               (uint)(0x7ff < nbSeq));
    if (((sVar1 < 0xffffffffffffff89) &&
        (sVar1 = FSE_writeNCount(dst,dstCapacity,(short *)entropyWorkspace,max,tableLog),
        sVar1 < 0xffffffffffffff89)) &&
       (sVar2 = FSE_buildCTable_wksp
                          (nextCTable,(short *)entropyWorkspace,max,tableLog,
                           (void *)((long)entropyWorkspace + 0x6c),0x2d8),
       0xffffffffffffff88 < sVar2)) {
      sVar1 = sVar2;
    }
    break;
  case set_repeat:
    memcpy(nextCTable,prevCTable,prevCTableSize);
    sVar1 = 0;
    break;
  default:
    sVar1 = 0xffffffffffffffff;
  }
  return sVar1;
}

Assistant:

size_t
ZSTD_buildCTable(void* dst, size_t dstCapacity,
                FSE_CTable* nextCTable, U32 FSELog, symbolEncodingType_e type,
                unsigned* count, U32 max,
                const BYTE* codeTable, size_t nbSeq,
                const S16* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                const FSE_CTable* prevCTable, size_t prevCTableSize,
                void* entropyWorkspace, size_t entropyWorkspaceSize)
{
    BYTE* op = (BYTE*)dst;
    const BYTE* const oend = op + dstCapacity;
    DEBUGLOG(6, "ZSTD_buildCTable (dstCapacity=%u)", (unsigned)dstCapacity);

    switch (type) {
    case set_rle:
        FORWARD_IF_ERROR(FSE_buildCTable_rle(nextCTable, (BYTE)max), "");
        RETURN_ERROR_IF(dstCapacity==0, dstSize_tooSmall, "not enough space");
        *op = codeTable[0];
        return 1;
    case set_repeat:
        ZSTD_memcpy(nextCTable, prevCTable, prevCTableSize);
        return 0;
    case set_basic:
        FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, defaultNorm, defaultMax, defaultNormLog, entropyWorkspace, entropyWorkspaceSize), "");  /* note : could be pre-calculated */
        return 0;
    case set_compressed: {
        ZSTD_BuildCTableWksp* wksp = (ZSTD_BuildCTableWksp*)entropyWorkspace;
        size_t nbSeq_1 = nbSeq;
        const U32 tableLog = FSE_optimalTableLog(FSELog, nbSeq, max);
        if (count[codeTable[nbSeq-1]] > 1) {
            count[codeTable[nbSeq-1]]--;
            nbSeq_1--;
        }
        assert(nbSeq_1 > 1);
        assert(entropyWorkspaceSize >= sizeof(ZSTD_BuildCTableWksp));
        (void)entropyWorkspaceSize;
        FORWARD_IF_ERROR(FSE_normalizeCount(wksp->norm, tableLog, count, nbSeq_1, max, ZSTD_useLowProbCount(nbSeq_1)), "");
        {   size_t const NCountSize = FSE_writeNCount(op, oend - op, wksp->norm, max, tableLog);   /* overflow protected */
            FORWARD_IF_ERROR(NCountSize, "FSE_writeNCount failed");
            FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, wksp->norm, max, tableLog, wksp->wksp, sizeof(wksp->wksp)), "");
            return NCountSize;
        }
    }
    default: assert(0); RETURN_ERROR(GENERIC, "impossible to reach");
    }
}